

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O3

void __thiscall vector_<char>::push_back(vector_<char> *this,char *val)

{
  size_t sVar1;
  
  sVar1 = this->_size;
  if (this->capacity < sVar1 + 1) {
    resize(this);
    sVar1 = this->_size;
  }
  (this->arr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl[sVar1] = *val;
  this->_size = this->_size + 1;
  return;
}

Assistant:

void push_back(const T &val) {
        if (_size + 1 > capacity) {
            resize();
        }

        arr[_size] = val;
        ++_size;
    }